

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O2

void __thiscall duckdb_re2::Prog::~Prog(Prog *this)

{
  DeleteDFA(this,this->dfa_longest_);
  DeleteDFA(this,this->dfa_first_);
  if ((this->prefix_foldcase_ == true) && ((this->field_11).prefix_dfa_ != (uint64_t *)0x0)) {
    operator_delete__((this->field_11).prefix_dfa_);
  }
  std::unique_ptr<unsigned_char[],_duckdb_re2::PODArray<unsigned_char>::Deleter>::~unique_ptr
            (&(this->onepass_nodes_).ptr_);
  std::unique_ptr<duckdb_re2::Prog::Inst[],_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>::
  ~unique_ptr(&(this->inst_).ptr_);
  std::unique_ptr<unsigned_short[],_duckdb_re2::PODArray<unsigned_short>::Deleter>::~unique_ptr
            (&(this->list_heads_).ptr_);
  return;
}

Assistant:

Prog::~Prog() {
  DeleteDFA(dfa_longest_);
  DeleteDFA(dfa_first_);
  if (prefix_foldcase_)
    delete[] prefix_dfa_;
}